

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::flags_internal::FlagImpl::IsSpecifiedOnCommandLine(FlagImpl *this)

{
  byte bVar1;
  Mutex *mu;
  MutexLock local_18;
  MutexLock l;
  FlagImpl *this_local;
  
  l.mu_ = (Mutex *)this;
  mu = DataGuard(this);
  MutexLock::MutexLock(&local_18,mu);
  bVar1 = this->field_0x29;
  MutexLock::~MutexLock(&local_18);
  return (bool)(bVar1 >> 3 & 1);
}

Assistant:

bool FlagImpl::IsSpecifiedOnCommandLine() const {
  absl::MutexLock l(DataGuard());
  return on_command_line_;
}